

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsServer.cpp
# Opt level: O2

void __thiscall Scs::Server::~Server(Server *this)

{
  (this->super_IServer)._vptr_IServer = (_func_int **)&PTR__Server_0010eb68;
  LogWriteLine("Shutting down server.");
  LOCK();
  (this->m_shutDown)._M_base._M_i = true;
  UNLOCK();
  if ((this->m_thread)._M_id._M_thread != 0) {
    std::thread::join();
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Scs::Allocator<char>_>::~basic_string
            (&this->m_port);
  std::_Function_base::~_Function_base(&(this->m_onUpdate).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_onReceiveData).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_onDisconnect).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_onConnect).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_onStartListening).super__Function_base);
  std::condition_variable::~condition_variable(&this->m_stateCondition);
  std::thread::~thread(&this->m_thread);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_listenerSocket).super___shared_ptr<Scs::Socket,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::
  _List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
  ::_M_clear(&(this->m_connectionList).
              super__List_base<std::shared_ptr<Scs::Server::ClientConnection>,_Scs::Allocator<std::shared_ptr<Scs::Server::ClientConnection>_>_>
            );
  return;
}

Assistant:

Server::~Server()
{
	LogWriteLine("Shutting down server.");
    m_shutDown = true;
	if (m_thread.joinable())
		m_thread.join();
}